

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O2

RWNode * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createCallToUndefinedFunction
          (LLVMReadWriteGraphBuilder *this,Function *function,CallInst *CInst)

{
  bool bVar1;
  AllocationFunction type;
  RWNode *pRVar2;
  LLVMDataDependenceAnalysisOptions *pLVar3;
  StringRef SVar4;
  StringRef RHS;
  StringRef RHS_00;
  StringRef RHS_01;
  StringRef local_58;
  string local_48;
  
  if (((byte)function[0x21] & 0x20) != 0) {
    pRVar2 = createIntrinsicCall(this,CInst);
    return pRVar2;
  }
  pLVar3 = this->_options;
  if (pLVar3[0x98] == (LLVMDataDependenceAnalysisOptions)0x1) {
    SVar4 = (StringRef)llvm::Value::getName();
    RHS.Length = 0xe;
    RHS.Data = "pthread_create";
    bVar1 = llvm::operator==(SVar4,RHS);
    if (bVar1) {
      pRVar2 = createPthreadCreateCalls(this,CInst);
      return pRVar2;
    }
    SVar4 = (StringRef)llvm::Value::getName();
    RHS_00.Length = 0xc;
    RHS_00.Data = "pthread_join";
    bVar1 = llvm::operator==(SVar4,RHS_00);
    if (bVar1) {
      pRVar2 = createPthreadJoinCall(this,CInst);
      return pRVar2;
    }
    SVar4 = (StringRef)llvm::Value::getName();
    RHS_01.Length = 0xc;
    RHS_01.Data = "pthread_exit";
    bVar1 = llvm::operator==(SVar4,RHS_01);
    if (bVar1) {
      pRVar2 = createReturn(this,(Instruction *)CInst);
      return pRVar2;
    }
    pLVar3 = this->_options;
  }
  local_58 = (StringRef)llvm::Value::getName();
  llvm::StringRef::str_abi_cxx11_(&local_48,&local_58);
  type = AnalysisOptions::getAllocationFunction((AnalysisOptions *)(pLVar3 + 0x20),&local_48);
  std::__cxx11::string::_M_dispose();
  if (type == NONE) {
    pRVar2 = createUnknownCall(this,CInst);
  }
  else if (type == REALLOC) {
    pRVar2 = createRealloc(this,(Instruction *)CInst);
  }
  else {
    pRVar2 = createDynAlloc(this,(Instruction *)CInst,type);
  }
  return pRVar2;
}

Assistant:

RWNode *LLVMReadWriteGraphBuilder::createCallToUndefinedFunction(
        const llvm::Function *function, const llvm::CallInst *CInst) {
    if (function->isIntrinsic()) {
        return createIntrinsicCall(CInst);
    }
    if (_options.threads) {
        // assert(false && "Threads unsupported yet");
        if (function->getName() == "pthread_create") {
            return createPthreadCreateCalls(CInst);
        } else if (function->getName() == "pthread_join") {
            return createPthreadJoinCall(CInst);
        } else if (function->getName() == "pthread_exit") {
            return createPthreadExitCall(CInst);
        }
    }

    auto type = _options.getAllocationFunction(function->getName().str());
    if (type != AllocationFunction::NONE) {
        if (type == AllocationFunction::REALLOC)
            return createRealloc(CInst);
        return createDynAlloc(CInst, type);
    }
    return createUnknownCall(CInst);

    assert(false && "Unreachable");
    abort();
}